

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O3

Error asmjit::X86Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint32_t advance;
  uint32_t uVar7;
  char *pcVar8;
  undefined1 *puVar9;
  uint uVar10;
  Operand_ *op;
  uint uVar11;
  uint32_t count;
  ulong uVar12;
  uint uVar13;
  anon_union_16_7_ed616b9d_for_Operand__0 local_40;
  
  uVar1 = detail->options;
  uVar2 = detail->instId;
  uVar6 = (ulong)uVar2;
  if (uVar6 < 0x59c) {
    if (((uVar1 & 0x40) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"short ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((char)uVar1 < '\0') &&
       (EVar3 = StringBuilder::_opString(sb,1,"long ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xacquire ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x11 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xrelease ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xd & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"lock ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if ((uVar1 & 0xc000) != 0) {
      pcVar8 = "rep ";
      if ((uVar1 >> 0xe & 1) == 0) {
        pcVar8 = "repnz ";
      }
      StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
      if ((detail->extraReg)._signature != 0) {
        EVar3 = StringBuilder::_opChar(sb,1,'{');
        if (EVar3 != 0) {
          return EVar3;
        }
        local_40._packed[0] = (UInt64)detail->extraReg;
        local_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        EVar3 = formatOperand(sb,logOptions,emitter,archType,(Operand_ *)&local_40._any);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = StringBuilder::_opString(sb,1,"} ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0x1e000000) == 0) {
        EVar3 = StringBuilder::_opString(sb,1,"rex ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      else {
        StringBuilder::_opString(sb,1,"rex.",0xffffffffffffffff);
        if ((uVar1 >> 0x1b & 1) != 0) {
          StringBuilder::_opChar(sb,1,'r');
        }
        if ((uVar1 >> 0x1a & 1) != 0) {
          StringBuilder::_opChar(sb,1,'x');
        }
        if ((uVar1 >> 0x19 & 1) != 0) {
          StringBuilder::_opChar(sb,1,'b');
        }
        if ((uVar1 >> 0x1c & 1) != 0) {
          StringBuilder::_opChar(sb,1,'w');
        }
        StringBuilder::_opChar(sb,1,' ');
      }
    }
    if (((uVar1 >> 10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"vex3 ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xc & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"evex ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    EVar3 = StringBuilder::_opString
                      (sb,1,&X86InstDB::nameData +
                            (*(uint *)(X86InstDB::instData + uVar6 * 0xc) >> 8 & 0x3fff),
                       0xffffffffffffffff);
  }
  else {
    EVar3 = StringBuilder::appendFormat(sb,"<unknown id=#%u>",uVar6);
  }
  if (EVar3 == 0) {
    if (opCount != 0) {
      uVar13 = 0;
      do {
        if ((undefined1  [16])((undefined1  [16])opArray[uVar13].field_0 & (undefined1  [16])0x7) ==
            (undefined1  [16])0x0) break;
        pcVar8 = ", ";
        if (uVar13 == 0) {
          pcVar8 = " ";
        }
        EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        op = opArray + uVar13;
        EVar3 = formatOperand(sb,logOptions,emitter,archType,op);
        if (EVar3 != 0) {
          return EVar3;
        }
        if (((logOptions & 2) == 0) || (((op->field_0)._any.signature & 7) != 3))
        goto switchD_00163953_caseD_41f;
        lVar5 = 0;
        uVar6 = 0x10;
        do {
          uVar10 = *(uint *)((long)&opArray->field_0 + lVar5);
          uVar11 = uVar10 >> 0x18;
          uVar12 = (ulong)uVar11;
          if (uVar11 < (uint)uVar6) {
            uVar12 = uVar6;
          }
          if ((uVar10 & 7) != 1) {
            uVar12 = uVar6;
          }
          lVar5 = lVar5 + 0x10;
          uVar6 = uVar12;
        } while ((ulong)opCount << 4 != lVar5);
        uVar11 = (uint)uVar12;
        uVar10 = (uint)*(byte *)((long)&op->field_0 + 8);
        if ((int)uVar2 < 0x41e) {
          if ((int)uVar2 < 0x27a) {
            if ((int)uVar2 < 0x1ae) {
              uVar4 = uVar2 - 0x68;
              if (uVar4 < 0x2f) {
                if ((0x1bUL >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
                  uVar7 = 3;
LAB_00163a1a:
                  puVar9 = "eq_oq";
                  advance = 0;
                  count = 1;
                  goto LAB_00163b06;
                }
                if ((0x600000000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)
                goto switchD_00163953_caseD_420;
              }
              if (uVar2 == 0x22) goto switchD_00163953_caseD_455;
              if (uVar2 == 0x23) {
LAB_00163ba0:
                uVar4 = uVar11 >> 2;
                goto LAB_00163bf1;
              }
            }
            else if ((int)uVar2 < 0x240) {
              if (uVar2 == 0x1d5) goto switchD_00163953_caseD_420;
              if (uVar2 == 0x1ae) {
LAB_00163dd0:
                puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vmpsadbw;
                uVar7 = uVar11 >> 3;
                if (3 < uVar11 >> 3) {
                  uVar7 = 4;
                }
                goto LAB_00163dba;
              }
              if (uVar2 == 0x1d6) goto switchD_00163953_caseD_427;
            }
            else if ((uVar2 - 0x241 < 3) || (uVar2 == 0x240)) goto switchD_00163953_caseD_456;
          }
          else if ((int)uVar2 < 0x307) {
            if ((int)uVar2 < 0x2f5) {
              if (uVar2 == 0x2b4) goto switchD_001639c4_caseD_569;
              if (uVar2 == 0x2b5) goto switchD_001639c4_caseD_56a;
              if (uVar2 - 0x27a < 4) goto switchD_001639c4_caseD_547;
            }
            else {
              if (uVar2 == 0x2f5) goto switchD_00163953_caseD_455;
              if (uVar2 == 0x2f6) goto LAB_00163ba0;
            }
          }
          else if ((int)uVar2 < 0x33e) {
            if (uVar2 - 0x307 < 4) {
              uVar7 = 5;
              goto LAB_00163a1a;
            }
            if (uVar2 == 0x339) goto switchD_00163953_caseD_456;
            if (uVar2 == 0x319) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vroundxx;
              goto LAB_00163d95;
            }
          }
          else if ((int)uVar2 < 0x3a5) {
            if (uVar2 - 0x33e < 2) goto switchD_00163953_caseD_420;
          }
          else {
            if (uVar2 - 0x3a5 < 4) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vfpclassxx;
LAB_00163d95:
              uVar7 = 1;
              goto LAB_00163dba;
            }
            if (uVar2 - 0x3bd < 4) {
              puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                        ::vgetmantxx;
              goto LAB_00163d84;
            }
            if (uVar2 == 0x3fc) goto LAB_00163dd0;
          }
          goto switchD_00163953_caseD_41f;
        }
        if (0x4f8 < (int)uVar2) {
          switch(uVar2) {
          case 0x53f:
          case 0x540:
          case 0x541:
          case 0x542:
          case 0x543:
          case 0x544:
          case 0x545:
          case 0x546:
            puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                      ::vreducexx_vrndscalexx;
LAB_00163d84:
            uVar7 = 3;
            goto LAB_00163dba;
          case 0x547:
          case 0x548:
          case 0x549:
          case 0x54a:
switchD_001639c4_caseD_547:
            puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                      ::vroundxx;
            goto LAB_00163db5;
          case 0x54b:
          case 0x54c:
          case 0x54d:
          case 0x54e:
          case 0x54f:
          case 0x550:
          case 0x551:
          case 0x552:
          case 0x553:
          case 0x554:
          case 0x555:
          case 0x556:
          case 0x557:
          case 0x558:
          case 0x559:
          case 0x55a:
          case 0x55b:
          case 0x55c:
          case 0x55d:
          case 0x55e:
          case 0x55f:
          case 0x560:
          case 0x561:
          case 0x562:
          case 0x563:
          case 0x564:
            break;
          case 0x565:
          case 0x566:
          case 0x567:
          case 0x568:
            uVar4 = (uint)(uVar12 >> 4);
            if (uVar4 < 3) {
              uVar4 = 2;
            }
            uVar7 = 2 - (uVar11 < 0x30);
            goto LAB_00163c17;
          case 0x569:
switchD_001639c4_caseD_569:
            uVar7 = 1;
            advance = 2;
            puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vshufpd;
            count = uVar11 >> 3;
            if (7 < uVar11 >> 3) {
              count = 8;
            }
            goto LAB_00163b06;
          case 0x56a:
switchD_001639c4_caseD_56a:
            puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vshufps;
            goto LAB_00163b00;
          default:
            uVar6 = (ulong)(uVar2 - 0x4fa);
            if (uVar2 - 0x4fa < 0x3b) {
              if ((3UL >> (uVar6 & 0x3f) & 1) != 0) goto switchD_00163953_caseD_456;
              if ((0x600000000U >> (uVar6 & 0x3f) & 1) != 0) goto switchD_00163953_caseD_420;
              if ((0x780000000000000U >> (uVar6 & 0x3f) & 1) != 0) {
                puVar9 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                          ::vrangexx;
                goto LAB_00163db5;
              }
            }
            if (uVar2 == 0x4f9) goto switchD_00163953_caseD_456;
          }
          goto switchD_00163953_caseD_41f;
        }
        switch(uVar2) {
        case 0x41e:
          uVar4 = uVar11 >> 2;
          if (7 < uVar4) {
            uVar4 = 8;
          }
          goto LAB_00163bf1;
        default:
          goto switchD_00163953_caseD_41f;
        case 0x420:
switchD_00163953_caseD_420:
          uVar7 = 1;
          uVar4 = 8;
          break;
        case 0x427:
switchD_00163953_caseD_427:
          puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vpclmulqdq;
          goto LAB_00163db5;
        case 0x429:
        case 0x42a:
        case 0x437:
        case 0x438:
        case 0x439:
        case 0x43a:
        case 0x43b:
        case 0x43c:
          puVar9 = "eq";
          goto LAB_00163b00;
        case 0x43d:
        case 0x43e:
        case 0x441:
        case 0x442:
        case 0x443:
        case 0x444:
        case 0x445:
        case 0x446:
          puVar9 = "lt";
LAB_00163b00:
          uVar7 = 2;
          advance = 4;
          count = 4;
LAB_00163b06:
          EVar3 = X86Logging_formatImmText(sb,uVar10,uVar7,advance,puVar9,count);
          goto LAB_00163c1c;
        case 0x449:
        case 0x44a:
          puVar9 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vperm2x128;
LAB_00163db5:
          uVar7 = 2;
LAB_00163dba:
          EVar3 = X86Logging_formatImmBits(sb,uVar10,(ImmBits *)puVar9,uVar7);
          goto LAB_00163c1c;
        case 0x455:
switchD_00163953_caseD_455:
          uVar4 = uVar11 >> 3;
LAB_00163bf1:
          uVar7 = 1;
          break;
        case 0x456:
        case 0x457:
        case 0x459:
switchD_00163953_caseD_456:
          uVar7 = 2;
          uVar4 = 4;
        }
LAB_00163c17:
        EVar3 = X86Logging_formatImmShuf(sb,uVar10,uVar7,uVar4);
LAB_00163c1c:
        if (EVar3 != 0) {
          return EVar3;
        }
switchD_00163953_caseD_41f:
        if (uVar13 == 0) {
          if (((detail->extraReg)._signature & 0xf00) == 0x300) {
            EVar3 = StringBuilder::_opString(sb,1," {",0xffffffffffffffff);
            if (EVar3 != 0) {
              return EVar3;
            }
            local_40._packed[0] = (UInt64)detail->extraReg;
            local_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
            EVar3 = formatOperand(sb,logOptions,emitter,archType,(Operand_ *)&local_40._any);
            if (EVar3 != 0) {
              return EVar3;
            }
            EVar3 = StringBuilder::_opChar(sb,1,'}');
            if (EVar3 != 0) {
              return EVar3;
            }
            if ((uVar1 >> 0x17 & 1) != 0) {
              pcVar8 = "{z}";
LAB_00163cf1:
              EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
              if (EVar3 != 0) {
                return EVar3;
              }
            }
          }
          else if ((uVar1 >> 0x17 & 1) != 0) {
            pcVar8 = " {z}";
            goto LAB_00163cf1;
          }
        }
        if ((((op->field_0)._any.signature & 7) == 2 && (uVar1 >> 0x14 & 1) != 0) &&
           (EVar3 = StringBuilder::_opString(sb,1," {1tox}",0xffffffffffffffff), EVar3 != 0)) {
          return EVar3;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != opCount);
    }
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  // Format instruction options and instruction mnemonic.
  if (instId < X86Inst::_kIdCount) {
    const X86Inst& instInfo = X86Inst::getInst(instId);

    // SHORT|LONG options.
    if (options & X86Inst::kOptionShortForm) ASMJIT_PROPAGATE(sb.appendString("short "));
    if (options & X86Inst::kOptionLongForm) ASMJIT_PROPAGATE(sb.appendString("long "));

    // LOCK|XACQUIRE|XRELEASE options.
    if (options & X86Inst::kOptionXAcquire) ASMJIT_PROPAGATE(sb.appendString("xacquire "));
    if (options & X86Inst::kOptionXRelease) ASMJIT_PROPAGATE(sb.appendString("xrelease "));
    if (options & X86Inst::kOptionLock) ASMJIT_PROPAGATE(sb.appendString("lock "));

    // REP|REPNZ options.
    if (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) {
      sb.appendString((options & X86Inst::kOptionRep) ? "rep " : "repnz ");
      if (detail.hasExtraReg()) {
        ASMJIT_PROPAGATE(sb.appendChar('{'));
        ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, detail.extraReg.toReg<Reg>()));
        ASMJIT_PROPAGATE(sb.appendString("} "));
      }
    }

    // REX options.
    if (options & X86Inst::kOptionRex) {
      const uint32_t kRXBWMask = X86Inst::kOptionOpCodeR |
                                 X86Inst::kOptionOpCodeX |
                                 X86Inst::kOptionOpCodeB |
                                 X86Inst::kOptionOpCodeW ;
      if (options & kRXBWMask) {
        sb.appendString("rex.");
        if (options & X86Inst::kOptionOpCodeR) sb.appendChar('r');
        if (options & X86Inst::kOptionOpCodeX) sb.appendChar('x');
        if (options & X86Inst::kOptionOpCodeB) sb.appendChar('b');
        if (options & X86Inst::kOptionOpCodeW) sb.appendChar('w');
        sb.appendChar(' ');
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString("rex "));
      }
    }

    // VEX|EVEX options.
    if (options & X86Inst::kOptionVex3) ASMJIT_PROPAGATE(sb.appendString("vex3 "));
    if (options & X86Inst::kOptionEvex) ASMJIT_PROPAGATE(sb.appendString("evex "));

    ASMJIT_PROPAGATE(sb.appendString(instInfo.getName()));
  }
  else {
    ASMJIT_PROPAGATE(sb.appendFormat("<unknown id=#%u>", static_cast<unsigned int>(instId)));
  }

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand_& op = opArray[i];
    if (op.isNone()) break;

    ASMJIT_PROPAGATE(sb.appendString(i == 0 ? " " : ", "));
    ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, op));

    if (op.isImm() && (logOptions & Logger::kOptionImmExtended)) {
      uint32_t vecSize = 16;
      for (uint32_t j = 0; j < opCount; j++)
        if (opArray[j].isReg())
          vecSize = std::max<uint32_t>(vecSize, opArray[j].getSize());
      ASMJIT_PROPAGATE(X86Logging_formatImmExtended(sb, logOptions, instId, vecSize, op.as<Imm>()));
    }

    // Support AVX-512 {k}{z}.
    if (i == 0) {
      if (detail.extraReg.getKind() == X86Reg::kKindK) {
        ASMJIT_PROPAGATE(sb.appendString(" {"));
        ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, detail.extraReg.toReg<Reg>()));
        ASMJIT_PROPAGATE(sb.appendChar('}'));

        if (options & X86Inst::kOptionZMask)
          ASMJIT_PROPAGATE(sb.appendString("{z}"));
      }
      else if (options & X86Inst::kOptionZMask) {
        ASMJIT_PROPAGATE(sb.appendString(" {z}"));
      }
    }

    // Support AVX-512 {1tox}.
    if (op.isMem() && (options & X86Inst::kOption1ToX))
      ASMJIT_PROPAGATE(sb.appendString(" {1tox}"));
  }

  return kErrorOk;
}